

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_logger-inl.h
# Opt level: O2

void __thiscall spdlog::async_logger::flush_(async_logger *this)

{
  spdlog_ex *this_00;
  async_logger_ptr aStack_58;
  shared_ptr<spdlog::details::thread_pool> pool_ptr;
  string local_38;
  
  std::__shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&pool_ptr.super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>,
             &this->thread_pool_);
  if (pool_ptr.super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    std::__shared_ptr<spdlog::async_logger,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<spdlog::async_logger,void>
              ((__shared_ptr<spdlog::async_logger,(__gnu_cxx::_Lock_policy)2> *)&aStack_58,
               (__weak_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<spdlog::async_logger>);
    details::thread_pool::post_flush
              (pool_ptr.super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,&aStack_58,this->overflow_policy_);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&aStack_58.super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pool_ptr.
                super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return;
  }
  this_00 = (spdlog_ex *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"async flush: thread pool doesn\'t exist anymore",
             (allocator<char> *)&aStack_58);
  spdlog_ex::spdlog_ex(this_00,&local_38);
  __cxa_throw(this_00,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
}

Assistant:

SPDLOG_INLINE void spdlog::async_logger::flush_()
{
    if (auto pool_ptr = thread_pool_.lock())
    {
        pool_ptr->post_flush(shared_from_this(), overflow_policy_);
    }
    else
    {
        SPDLOG_THROW(spdlog_ex("async flush: thread pool doesn't exist anymore"));
    }
}